

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

Ignored __thiscall
duckdb_re2::CaptureNamesWalker::PreVisit
          (CaptureNamesWalker *this,Regexp *re,Ignored ignored,bool *stop)

{
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  key_type_conflict1 local_24;
  
  if ((re->op_ == '\v') && ((re->arguments).capture.name_ != (string *)0x0)) {
    this_00 = this->map_;
    if (this_00 ==
        (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x0) {
      this_00 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)operator_new(0x30);
      p_Var1 = &(this_00->_M_t)._M_impl.super__Rb_tree_header;
      (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      (this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      this->map_ = this_00;
    }
    pmVar2 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_24);
    std::__cxx11::string::_M_assign((string *)pmVar2);
  }
  return ignored;
}

Assistant:

virtual Ignored PreVisit(Regexp* re, Ignored ignored, bool* stop) {
    if (re->op() == kRegexpCapture && re->name() != NULL) {
      // Allocate map once we find a name.
      if (map_ == NULL)
        map_ = new std::map<int, std::string>;

      (*map_)[re->cap()] = *re->name();
    }
    return ignored;
  }